

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpMeshHandler.c
# Opt level: O0

void sbfTcpMeshHandlerConnectionTimerCb(int fd,short events,void *closure)

{
  int iVar1;
  undefined8 *in_RDX;
  int s;
  timeval tv;
  int error;
  sbfTcpMeshHandlerConnection c;
  sbfTcpMeshHandlerConnection c_00;
  
  c_00 = (sbfTcpMeshHandlerConnection)0x3;
  sbfLog_log(*(undefined8 *)*in_RDX,1,"trying connection %p to %s:%hu",in_RDX,in_RDX[0x12],
             *(undefined2 *)(in_RDX + 0x13));
  sbfTcpMeshHandlerCloseSocket((sbfTcpMeshHandlerConnection)0x10351d);
  iVar1 = socket(2,1,6);
  if (-1 < iVar1) {
    sbfTcpMeshHandlerSetSocket(c_00,iVar1);
    iVar1 = bufferevent_socket_connect_hostname
                      (in_RDX[0x14],0,2,in_RDX[0x12],*(undefined2 *)(in_RDX + 0x13));
    if (iVar1 == 0) {
      return;
    }
  }
  sbfLog_log(*(undefined8 *)*in_RDX,1,"connection %p failed",in_RDX);
  event_add(in_RDX + 1,&stack0xffffffffffffffd0);
  return;
}

Assistant:

static void
sbfTcpMeshHandlerConnectionTimerCb (int fd, short events, void* closure)
{
    sbfTcpMeshHandlerConnection c = closure;
    int                         error;
    struct timeval              tv = SBF_TCP_MESH_HANDLER_CONNECT_INTERVAL;
    evutil_socket_t             s;

    sbfLog_info (c->mParent->mLog,
                 "trying connection %p to %s:%hu",
                 c,
                 c->mHost,
                 c->mPort);

    sbfTcpMeshHandlerCloseSocket (c);

    s = socket (AF_INET, SOCK_STREAM, IPPROTO_TCP);
    if (s < 0)
        goto fail;
    sbfTcpMeshHandlerSetSocket (c, s);

    error = bufferevent_socket_connect_hostname (c->mEvent,
                                                 NULL,
                                                 AF_INET,
                                                 c->mHost,
                                                 c->mPort);
    if (error != 0)
        goto fail;

    return;

fail:
    sbfLog_info (c->mParent->mLog, "connection %p failed", c);
    event_add (&c->mTimer, &tv);
}